

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.h
# Opt level: O2

CornerIndex __thiscall
draco::MeshAttributeCornerTable::SwingLeft(MeshAttributeCornerTable *this,CornerIndex corner)

{
  CornerIndex CVar1;
  uint uVar2;
  
  CVar1.value_ = 0xffffffff;
  if (corner.value_ != 0xffffffff) {
    CVar1.value_ = corner.value_ - 2;
    if ((corner.value_ + 1) % 3 != 0) {
      CVar1.value_ = corner.value_ + 1;
    }
  }
  CVar1 = Opposite(this,CVar1);
  uVar2 = 0xffffffff;
  if (CVar1.value_ != 0xffffffff) {
    uVar2 = CVar1.value_ - 2;
    if ((CVar1.value_ + 1) % 3 != 0) {
      uVar2 = CVar1.value_ + 1;
    }
  }
  return (CornerIndex)uVar2;
}

Assistant:

inline CornerIndex SwingLeft(CornerIndex corner) const {
    return Next(Opposite(Next(corner)));
  }